

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderPackingFunctionTests::init
          (ShaderPackingFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  undefined8 in_RAX;
  PackSnorm4x8Case *this_00;
  undefined8 extraout_RAX;
  TestNode *pTVar1;
  undefined8 extraout_RAX_00;
  PackUnorm4x8Case *this_01;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  PackSnorm2x16Case *this_02;
  undefined8 extraout_RAX_03;
  undefined8 extraout_RAX_04;
  PackUnorm2x16Case *this_03;
  undefined8 extraout_RAX_05;
  undefined8 extraout_RAX_06;
  undefined8 extraout_RAX_07;
  undefined8 extraout_RAX_08;
  long lVar2;
  int prec;
  Precision PVar3;
  
  for (PVar3 = PRECISION_LOWP; PVar3 != PRECISION_LAST; PVar3 = PVar3 + PRECISION_MEDIUMP) {
    for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
      this_00 = (PackSnorm4x8Case *)operator_new(0x108);
      PackSnorm4x8Case::PackSnorm4x8Case
                (this_00,(this->super_TestCaseGroup).m_context,
                 *(ShaderType *)((long)&DAT_018a3870 + lVar2),PVar3);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      in_RAX = extraout_RAX;
    }
  }
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
    pTVar1 = (TestNode *)operator_new(0x100);
    UnpackSnorm4x8Case::UnpackSnorm4x8Case
              ((UnpackSnorm4x8Case *)pTVar1,(this->super_TestCaseGroup).m_context,
               *(ShaderType *)((long)&DAT_018a3870 + lVar2));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    in_RAX = extraout_RAX_00;
  }
  for (PVar3 = PRECISION_LOWP; PVar3 != PRECISION_LAST; PVar3 = PVar3 + PRECISION_MEDIUMP) {
    for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
      this_01 = (PackUnorm4x8Case *)operator_new(0x108);
      PackUnorm4x8Case::PackUnorm4x8Case
                (this_01,(this->super_TestCaseGroup).m_context,
                 *(ShaderType *)((long)&DAT_018a3870 + lVar2),PVar3);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
      in_RAX = extraout_RAX_01;
    }
  }
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
    pTVar1 = (TestNode *)operator_new(0x100);
    UnpackUnorm4x8Case::UnpackUnorm4x8Case
              ((UnpackUnorm4x8Case *)pTVar1,(this->super_TestCaseGroup).m_context,
               *(ShaderType *)((long)&DAT_018a3870 + lVar2));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    in_RAX = extraout_RAX_02;
  }
  for (PVar3 = PRECISION_LOWP; PVar3 != PRECISION_LAST; PVar3 = PVar3 + PRECISION_MEDIUMP) {
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
      this_02 = (PackSnorm2x16Case *)operator_new(0x108);
      PackSnorm2x16Case::PackSnorm2x16Case
                (this_02,(this->super_TestCaseGroup).m_context,
                 *(ShaderType *)((long)&DAT_018a38f8 + lVar2),PVar3);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
      in_RAX = extraout_RAX_03;
    }
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
    pTVar1 = (TestNode *)operator_new(0x100);
    UnpackSnorm2x16Case::UnpackSnorm2x16Case
              ((UnpackSnorm2x16Case *)pTVar1,(this->super_TestCaseGroup).m_context,
               *(ShaderType *)((long)&DAT_018a38f8 + lVar2));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    in_RAX = extraout_RAX_04;
  }
  for (PVar3 = PRECISION_LOWP; PVar3 != PRECISION_LAST; PVar3 = PVar3 + PRECISION_MEDIUMP) {
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
      this_03 = (PackUnorm2x16Case *)operator_new(0x108);
      PackUnorm2x16Case::PackUnorm2x16Case
                (this_03,(this->super_TestCaseGroup).m_context,
                 *(ShaderType *)((long)&DAT_018a38f8 + lVar2),PVar3);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
      in_RAX = extraout_RAX_05;
    }
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
    pTVar1 = (TestNode *)operator_new(0x100);
    UnpackUnorm2x16Case::UnpackUnorm2x16Case
              ((UnpackUnorm2x16Case *)pTVar1,(this->super_TestCaseGroup).m_context,
               *(ShaderType *)((long)&DAT_018a38f8 + lVar2));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    in_RAX = extraout_RAX_06;
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
    pTVar1 = (TestNode *)operator_new(0x100);
    PackHalf2x16Case::PackHalf2x16Case
              ((PackHalf2x16Case *)pTVar1,(this->super_TestCaseGroup).m_context,
               *(ShaderType *)((long)&DAT_018a38f8 + lVar2));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    in_RAX = extraout_RAX_07;
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
    pTVar1 = (TestNode *)operator_new(0x100);
    UnpackHalf2x16Case::UnpackHalf2x16Case
              ((UnpackHalf2x16Case *)pTVar1,(this->super_TestCaseGroup).m_context,
               *(ShaderType *)((long)&DAT_018a38f8 + lVar2));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    in_RAX = extraout_RAX_08;
  }
  return (int)in_RAX;
}

Assistant:

void ShaderPackingFunctionTests::init (void)
{
	// New built-in functions in GLES 3.1
	{
		const glu::ShaderType allShaderTypes[] =
		{
			glu::SHADERTYPE_VERTEX,
			glu::SHADERTYPE_TESSELLATION_CONTROL,
			glu::SHADERTYPE_TESSELLATION_EVALUATION,
			glu::SHADERTYPE_GEOMETRY,
			glu::SHADERTYPE_FRAGMENT,
			glu::SHADERTYPE_COMPUTE
		};

		// packSnorm4x8
		for (int prec = 0; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
				addChild(new PackSnorm4x8Case(m_context, allShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackSnorm4x8
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
			addChild(new UnpackSnorm4x8Case(m_context, allShaderTypes[shaderTypeNdx]));

		// packUnorm4x8
		for (int prec = 0; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
				addChild(new PackUnorm4x8Case(m_context, allShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackUnorm4x8
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
			addChild(new UnpackUnorm4x8Case(m_context, allShaderTypes[shaderTypeNdx]));
	}

	// GLES 3 functions in new shader types.
	{
		const glu::ShaderType newShaderTypes[] =
		{
			glu::SHADERTYPE_GEOMETRY,
			glu::SHADERTYPE_COMPUTE
		};

		// packSnorm2x16
		for (int prec = 0; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
				addChild(new PackSnorm2x16Case(m_context, newShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackSnorm2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackSnorm2x16Case(m_context, newShaderTypes[shaderTypeNdx]));

		// packUnorm2x16
		for (int prec = 0; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
				addChild(new PackUnorm2x16Case(m_context, newShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackUnorm2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackUnorm2x16Case(m_context, newShaderTypes[shaderTypeNdx]));

		// packHalf2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new PackHalf2x16Case(m_context, newShaderTypes[shaderTypeNdx]));

		// unpackHalf2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackHalf2x16Case(m_context, newShaderTypes[shaderTypeNdx]));
	}
}